

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O1

boolean obstructed(int x,int y)

{
  uint uVar1;
  monst *pmVar2;
  boolean bVar3;
  int iVar4;
  obj *poVar5;
  char *pcVar6;
  monst *worm;
  
  pmVar2 = level->monsters[x][y];
  worm = (monst *)0x0;
  if ((pmVar2 != (monst *)0x0) && ((pmVar2->field_0x61 & 2) == 0)) {
    worm = pmVar2;
  }
  if ((worm == (monst *)0x0) || (worm->m_ap_type == '\x01')) {
    if (level->objects[x][y] == (obj *)0x0) {
      return '\0';
    }
LAB_001b6522:
    pline("Something\'s in the way.");
    return '\x01';
  }
  if (worm->m_ap_type == '\x02') goto LAB_001b6522;
  if (worm->wormno == '\0') {
    if (((viz_array[worm->my][worm->mx] & 2U) == 0) &&
       (((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
        (((viz_array[worm->my][worm->mx] & 1U) == 0 || ((worm->data->mflags3 & 0x200) == 0))))))
    goto LAB_001b663f;
LAB_001b65ea:
    uVar1 = *(uint *)&worm->field_0x60;
    if (((uVar1 & 2) != 0) && ((u.uprops[0xc].intrinsic == 0 && (u.uprops[0xc].extrinsic == 0)))) {
      if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_001b6632;
      goto LAB_001b663f;
    }
    if ((uVar1 & 0x280) != 0) goto LAB_001b663f;
LAB_001b6632:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_001b663f;
LAB_001b67a7:
    pcVar6 = Monnam(worm);
  }
  else {
    bVar3 = worm_known(level,worm);
    if (bVar3 != '\0') goto LAB_001b65ea;
LAB_001b663f:
    if (((((worm->data->mflags1 & 0x10000) == 0) &&
         ((poVar5 = which_armor(worm,4), poVar5 == (obj *)0x0 ||
          (poVar5 = which_armor(worm,4), poVar5->otyp != 0x4f)))) &&
        ((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
           ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) ||
         (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
          (iVar4 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), iVar4 < 0x41)))))) ||
       (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
        (bVar3 = match_warn_of_mon(worm), bVar3 != '\0')))) goto LAB_001b67a7;
    pcVar6 = "Some creature";
  }
  pline("%s stands in the way!",pcVar6);
  if (worm->wormno == '\0') {
    if (((viz_array[worm->my][worm->mx] & 2U) == 0) &&
       (((((u.uprops[0x1e].intrinsic != 0 || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
          || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
         ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
        (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)) ||
         (((viz_array[worm->my][worm->mx] & 1U) == 0 || ((worm->data->mflags3 & 0x200) == 0))))))))
    goto LAB_001b68e1;
  }
  else {
    bVar3 = worm_known(level,worm);
    if (bVar3 == '\0') goto LAB_001b68e1;
  }
  uVar1 = *(uint *)&worm->field_0x60;
  if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar1 & 0x280) != 0) goto LAB_001b68e1;
  }
  else if (((uVar1 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_001b68e1;
  if ((u._1052_1_ & 0x20) == 0) {
    return '\x01';
  }
LAB_001b68e1:
  if (((worm->data->mflags1 & 0x10000) == 0) &&
     ((poVar5 = which_armor(worm,4), poVar5 == (obj *)0x0 ||
      (poVar5 = which_armor(worm,4), poVar5->otyp != 0x4f)))) {
    if (((u.uprops[0x1e].intrinsic != 0) ||
        (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
         (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
       (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
        ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
          (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
          youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) {
      return '\x01';
    }
    if (((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) &&
       (iVar4 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), iVar4 < 0x41)) {
      return '\x01';
    }
  }
  if (u.uprops[0x42].intrinsic != 0) {
    return '\x01';
  }
  if (u.uprops[0x42].extrinsic != 0) {
    return '\x01';
  }
  bVar3 = match_warn_of_mon(worm);
  if (bVar3 != '\0') {
    return '\x01';
  }
  map_invisible(worm->mx,worm->my);
  return '\x01';
}

Assistant:

static boolean obstructed(int x, int y)
{
	struct monst *mtmp = m_at(level, x, y);

	if (mtmp && mtmp->m_ap_type != M_AP_FURNITURE) {
		if (mtmp->m_ap_type == M_AP_OBJECT) goto objhere;
		pline("%s stands in the way!", !canspotmon(level, mtmp) ?
			"Some creature" : Monnam(mtmp));
		if (!canspotmon(level, mtmp))
		    map_invisible(mtmp->mx, mtmp->my);
		return TRUE;
	}
	if (OBJ_AT(x, y)) {
objhere:	pline("Something's in the way.");
		return TRUE;
	}
	return FALSE;
}